

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.h
# Opt level: O0

void __thiscall
shift_window_transformer::SoftMax<float>::forward
          (SoftMax<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  Tensor<float> *this_00;
  float *pfVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  double dVar5;
  float local_38;
  int local_34;
  int local_30;
  int j_1;
  int j;
  float sum;
  int i;
  int dim;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  SoftMax<float> *this_local;
  
  _i = output;
  output_local = input;
  input_local = (Tensor<float> *)this;
  pfVar1 = (float *)std::vector<int,_std::allocator<int>_>::back(&input->shape);
  sum = *pfVar1;
  std::vector<float,_std::allocator<float>_>::clear
            (&_i->super_vector<float,_std::allocator<float>_>);
  std::vector<int,_std::allocator<int>_>::operator=(&_i->shape,&output_local->shape);
  j = 0;
  while( true ) {
    uVar2 = (ulong)j;
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      (&output_local->super_vector<float,_std::allocator<float>_>);
    if (sVar3 <= uVar2) break;
    j_1 = 0;
    for (local_30 = 0; local_30 < (int)sum; local_30 = local_30 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&output_local->super_vector<float,_std::allocator<float>_>,
                          (long)(j + local_30));
      dVar5 = exp((double)*pvVar4);
      j_1 = (int)(float)((double)(float)j_1 + dVar5);
    }
    for (local_34 = 0; this_00 = _i, local_34 < (int)sum; local_34 = local_34 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&output_local->super_vector<float,_std::allocator<float>_>,
                          (long)(j + local_34));
      dVar5 = exp((double)*pvVar4);
      local_38 = (float)(dVar5 / (double)(float)j_1);
      std::vector<float,_std::allocator<float>_>::push_back
                (&this_00->super_vector<float,_std::allocator<float>_>,&local_38);
    }
    j = (int)sum + j;
  }
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            int dim = input.shape.back();
            output.clear();
            output.shape = input.shape;
            for (int i = 0; i < input.size(); i += dim) {
                T sum = 0;
                for (int j = 0; j < dim; ++j) {
                    sum += exp(input[i + j]);
                }
                for (int j = 0; j < dim; ++j) {
                    output.push_back(exp(input[i + j]) / sum);
                }
            }
        }